

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O1

string * __thiscall
stackjit::ByteCodeParser::currentTokenToLower_abi_cxx11_
          (string *__return_storage_ptr__,ByteCodeParser *this)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  long lVar3;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  pbVar1 = (this->mTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_p = pbVar1[this->mTokenIndex]._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,_Var2._M_p,_Var2._M_p + pbVar1[this->mTokenIndex]._M_string_length)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_40 != 0) {
    lVar3 = 0;
    do {
      tolower((int)(char)local_48[lVar3]);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      lVar3 = lVar3 + 1;
    } while (local_40 != lVar3);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ByteCodeParser::currentTokenToLower() const {
		return toLower(currentToken());
	}